

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void random_fe_test(secp256k1_fe *x)

{
  int iVar1;
  uchar bin [32];
  secp256k1_fe *in_stack_ffffffffffffffd8;
  
  do {
    secp256k1_testrand256_test((uchar *)0x1355e1);
    iVar1 = secp256k1_fe_set_b32_limit(in_stack_ffffffffffffffd8,(uchar *)0x1355ee);
  } while (iVar1 == 0);
  return;
}

Assistant:

static void random_fe_test(secp256k1_fe *x) {
    unsigned char bin[32];
    do {
        secp256k1_testrand256_test(bin);
        if (secp256k1_fe_set_b32_limit(x, bin)) {
            return;
        }
    } while(1);
}